

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post_function.cc
# Opt level: O1

int main(void)

{
  sample<std::complex<double>_> *__return_storage_ptr__;
  learn_always<klogic::learning::sample<std::complex<double>_>,_std::complex<double>_> *picker;
  int iVar1;
  int iVar2;
  long *plVar3;
  ostream *this;
  ulong uVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  sample<std::complex<double>_> *desired_00;
  int step;
  long lVar6;
  int *__last;
  int desired;
  vector<int,_std::allocator<int>_> input;
  mvn neuron;
  teacher<klogic::mvn,_klogic::learning::sample<std::complex<double>_>,_klogic::learning::learn_error<std::complex<double>_>_>
  teacher;
  undefined1 local_bc [4];
  sample<std::complex<double>_> local_b8;
  void *local_90 [2];
  long local_80;
  mvn local_78;
  vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  local_58;
  mvn *local_40;
  
  klogic::mvn::mvn(&local_78,3,2);
  local_b8.input.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.input.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.input.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  ::vector(&local_58,
           (vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
            *)(local_bc + 4));
  __return_storage_ptr__ = (sample<std::complex<double>_> *)(local_bc + 4);
  local_40 = &local_78;
  std::
  vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  ::~vector((vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
             *)__return_storage_ptr__);
  __last = learning_samples[0] + 2;
  lVar6 = 9;
  do {
    desired_00 = __return_storage_ptr__;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)local_90,(int *)(__last + -2),__last,
               (allocator_type *)__return_storage_ptr__);
    local_bc = (undefined1  [4])*__last;
    klogic::transform::discrete<3,std::complex<double>,int>
              (__return_storage_ptr__,(transform *)local_90,
               (vector<int,_std::allocator<int>_> *)local_bc,(int *)desired_00);
    std::
    vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
    ::push_back(&local_58,__return_storage_ptr__);
    if (local_b8.input.
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.input.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.input.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.input.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90[0] != (void *)0x0) {
      operator_delete(local_90[0],local_80 - (long)local_90[0]);
    }
    __last = __last + 3;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Before hits: ",0xd);
  iVar1 = klogic::learning::
          teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
          ::hits<klogic::learning::single_discrete_match<3>>
                    ((teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
                      *)&local_58,(single_discrete_match<3> *)(local_bc + 4));
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar1 = 1;
  picker = (learn_always<klogic::learning::sample<std::complex<double>_>,_std::complex<double>_> *)
           (local_bc + 4);
  do {
    klogic::learning::
    teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
    ::
    learn_run<klogic::learning::learn_always<klogic::learning::sample<std::complex<double>>,std::complex<double>>>
              ((teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
                *)&local_58,picker);
    iVar2 = klogic::learning::
            teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
            ::hits<klogic::learning::single_discrete_match<3>>
                      ((teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
                        *)&local_58,(single_discrete_match<3> *)picker);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"After step ",0xb);
    this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(this," hits: ",7);
    plVar3 = (long *)std::ostream::operator<<(this,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    std::
    vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
    ::vector((vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
              *)picker,&local_58);
    uVar4 = (long)local_b8.input.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_b8.input.
                  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    std::
    vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
    ::~vector((vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
               *)picker);
    iVar1 = iVar1 + 1;
  } while (iVar2 != (int)(uVar4 >> 3) * -0x33333333);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MVN weights:",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  pbVar5 = (basic_ostream<char,_std::char_traits<char>_> *)std::ostream::flush();
  pbVar5 = klogic::operator<<(pbVar5,&local_78.weights);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar5 + -0x18) + (char)pbVar5);
  std::ostream::put((char)pbVar5);
  std::ostream::flush();
  std::
  vector<klogic::learning::sample<std::complex<double>_>,_std::allocator<klogic::learning::sample<std::complex<double>_>_>_>
  ::~vector(&local_58);
  if (local_78.weights.
      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.weights.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.weights.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.weights.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
    using namespace std;
    using namespace klogic;
    using namespace klogic::learning;
    using namespace klogic::transform;

    mvn neuron(K, 2);
    teacher<mvn> teacher(neuron);

    for (int i = 0; i < nsamples; ++i) {
        const int *inp_beg = &learning_samples[i][0], *inp_end = inp_beg + 2;
        vector<int> input(inp_beg, inp_end);
        int desired = inp_beg[2];

        teacher.add_sample(discrete<K, cmplx>(input, desired));
    }

    // cout << "Samples:" << endl << teacher.samples() << endl;

    cout << "Before hits: " << teacher.hits<single_discrete_match<K> >() << endl;

    for (int step = 1;; ++step) {
        // cout << "MVN weights:" << endl << neuron.weights_vector() << endl;

        teacher.learn_run();

        int hits = teacher.hits<single_discrete_match<K> >();

        cout << "After step " << step << " hits: " << hits << endl;

        if (hits == teacher.samples_count())
            break;
    }

    cout << "MVN weights:" << endl << neuron.weights_vector() << endl;

    return 0;
}